

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::CheckBoxStyle> __thiscall gui::DefaultTheme::makeCheckBoxStyle(DefaultTheme *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Gui *in_RDI;
  shared_ptr<gui::CheckBoxStyle> sVar1;
  shared_ptr<gui::CheckBoxStyle> *style;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  CheckBoxStyle *in_stack_ffffffffffffffa0;
  Vector3<float> local_30 [2];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<gui::CheckBoxStyle,gui::Gui_const&>(in_RDI);
  std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22163d);
  CheckBoxStyle::setFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x221658);
  CheckBoxStyle::setOutlineColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x221673);
  CheckBoxStyle::setOutlineThickness(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22168f);
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator*
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)in_stack_ffffffffffffffa0);
  CheckBoxStyle::setFont
            (in_stack_ffffffffffffffa0,
             (Font *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2216c4);
  CheckBoxStyle::setCharacterSize(in_stack_ffffffffffffffa0,(uint)in_stack_ffffffffffffff9c);
  std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2216dd);
  CheckBoxStyle::setTextFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2216f8);
  CheckBoxStyle::setFillColorHover
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x221713);
  CheckBoxStyle::setFillColorChecked
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = std::__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x22172e);
  sf::Vector3<float>::Vector3(local_30,8.0,1.0,*(float *)(in_RSI + 0x50));
  CheckBoxStyle::setTextPadding
            (this_00,(Vector3f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  sVar1.super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<gui::CheckBoxStyle>)
         sVar1.super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CheckBoxStyle> DefaultTheme::makeCheckBoxStyle() const {
    auto style = std::make_shared<CheckBoxStyle>(gui_);
    style->setFillColor(sf::Color::White);
    style->setOutlineColor(sf::Color::Black);
    style->setOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setFillColorHover(colorLightBlueTransparent);
    style->setFillColorChecked(colorDarkBlue);
    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}